

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O0

bool TRD_AddFile(path *fname,char *fhobname,int start,int length,int autostart,bool replace,
                bool addplace,int lengthMinusVars)

{
  byte bVar1;
  bool bVar2;
  char *id;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> uVar3;
  ETrdFileName EVar4;
  char *badValueMessage;
  uint *__s1;
  long lVar5;
  long lVar6;
  long lVar7;
  uchar *__p;
  pointer puVar8;
  __uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true> _Var9;
  size_t sVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  bool bVar14;
  uint local_a34;
  undefined1 local_a0c;
  undefined1 local_a0b;
  byte local_a0a;
  undefined1 local_a09;
  long lStack_a08;
  byte abin [4];
  long writePos;
  long entryPos;
  STrdFile *entry_2;
  uint entryIndex;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> dataToMove;
  size_t dataToMoveLength;
  long freePos;
  long newTargetEndPos;
  long oldTargetEndPos;
  long targetPos;
  int keepSectors;
  bool isNewTarget;
  STrdFile *target;
  string local_998;
  byte local_972;
  byte local_971;
  byte nextSector;
  uint *puStack_970;
  byte nextTrack;
  STrdFile *entry_1;
  STrdFile *entry;
  uint fatIndex;
  uint fileIndex;
  STrdHead trdHead;
  FILE *ff;
  int iStack_44;
  bool isExtensionB;
  ETrdFileName nameWarning;
  int Lname;
  STrdFile trdf;
  bool addplace_local;
  bool replace_local;
  int autostart_local;
  int length_local;
  int start_local;
  char *fhobname_local;
  path *fname_local;
  
  trdf.ext = addplace;
  iStack_44 = 0;
  trdf.addressLo = replace;
  trdf._10_4_ = autostart;
  unique0x100010fd = length;
  EVar4 = TRD_FileNameToBytes(fhobname,(byte *)((long)&nameWarning + 2),&stack0xffffffffffffffbc);
  bVar14 = trdf.filename[0] == 'B';
  if ((trdf.ext & 1) == 0) {
    if (EVar4 == INVALID_EXTENSION) {
      WarningById(W_TRD_EXT_INVALID,fhobname,W_PASS3);
    }
    if ((EVar4 == THREE_LETTER_EXTENSION) && (WarningById(W_TRD_EXT_3,fhobname,W_PASS3), bVar14)) {
      WarningById(W_TRD_EXT_B,fhobname,W_PASS3);
      iStack_44 = 9;
    }
  }
  if ((-1 < (int)trdf._10_4_) && ((!bVar14 || (9999 < (int)trdf._10_4_)))) {
    Warning("zx.trdimage_add_file: autostart value is BASIC program line number (0..9999) (in lua use -1 otherwise)."
            ,(char *)0x0,W_PASS3);
    trdf.addressHi = 0xff;
    trdf.length = 0xffff;
    trdf.sectorLength = 0xff;
  }
  if (lengthMinusVars != -1) {
    if (!bVar14) {
      Error("zx.trdimage_add_file: length without variables is for BASIC files only.",(char *)0x0,
            PASS3);
      fname_local._7_1_ = 0;
      goto LAB_0012aabf;
    }
    if ((lengthMinusVars < 0) || (stack0xffffffffffffffd8 < lengthMinusVars)) {
      Error("zx.trdimage_add_file: length without variables is not in <0..length> range.",
            (char *)0x0,PASS3);
      fname_local._7_1_ = 0;
      goto LAB_0012aabf;
    }
  }
  if (DeviceID == (char *)0x0) {
    Error("zx.trdimage_add_file: this function available only in real device emulation mode.",
          (char *)0x0,PASS3);
    fname_local._7_1_ = 0;
  }
  else if ((start < 0) || (0xffff < start)) {
    Error("zx.trdimage_add_file: start address must be in 0000..FFFF range",bp,PASS3);
    fname_local._7_1_ = 0;
  }
  else if ((stack0xffffffffffffffd8 < 1) || (0xff00 < stack0xffffffffffffffd8)) {
    Error("zx.trdimage_add_file: length must be in 0001..FF00 range",bp,PASS3);
    fname_local._7_1_ = 0;
  }
  else if (start + stack0xffffffffffffffd8 < 0x10001) {
    trdf.filename._3_2_ = SUB42(stack0xffffffffffffffd8,0);
    iVar11 = 0;
    if (-1 < (int)trdf._10_4_) {
      iVar11 = 4;
    }
    trdf.filename[5] = (byte)((uint)(stack0xffffffffffffffd8 + 0xff + iVar11) >> 8);
    if (bVar14) {
      trdf.filename[1] = (byte)stack0xffffffffffffffd8;
      trdf.filename[2] = (byte)((uint)stack0xffffffffffffffd8 >> 8);
      if (lengthMinusVars != -1) {
        trdf.filename._3_2_ = SUB42(lengthMinusVars,0);
      }
    }
    else if (iStack_44 < 10) {
      trdf.filename[1] = (byte)start;
      trdf.filename[2] = (byte)((uint)start >> 8);
    }
    if (trdf.filename[5] == '\0') {
      Error("zx.trdimage_add_file: sector length over 0xFF max",bp,PASS3);
      fname_local._7_1_ = 0;
    }
    else {
      trdHead.info._248_8_ = SJ_fopen(fname,"r+b");
      if ((FILE *)trdHead.info._248_8_ == (FILE *)0x0) {
        iVar11 = ReturnWithError("Error opening file",fname,(FILE *)0x0);
        fname_local._7_1_ = iVar11 != 0;
      }
      else {
        STrdHead::STrdHead((STrdHead *)&fatIndex);
        bVar14 = STrdHead::readFromFile((STrdHead *)&fatIndex,(FILE *)trdHead.info._248_8_);
        if (bVar14) {
          entry._4_4_ = 0x80;
          entry._0_4_ = 0;
          while ((id = W_TRD_DUPLICATE, (uint)entry < 0x80 &&
                 (entry_1 = (STrdFile *)(&fatIndex + (ulong)(uint)entry * 4),
                 entry_1->filename[0] != '\0'))) {
            iVar11 = memcmp(entry_1,(byte *)((long)&nameWarning + 2),(long)iStack_44);
            if (iVar11 == 0) {
              if ((((trdf.ext & 1) != 0) || ((trdf.addressLo & 1) != 0)) && (entry._4_4_ != 0x80)) {
                *(undefined1 *)(&fatIndex + (ulong)entry._4_4_ * 4) = 1;
                trdHead.info.password[2] = trdHead.info.password[2] + '\x01';
              }
              entry._4_4_ = (uint)entry;
            }
            entry._0_4_ = (uint)entry + 1;
          }
          if ((trdf.ext & 1) == 0) {
            if ((trdf.addressLo & 1) == 0) {
              if (entry._4_4_ != 0x80) {
                std::filesystem::__cxx11::path::string(&local_998,fname);
                badValueMessage = (char *)std::__cxx11::string::c_str();
                WarningById(id,badValueMessage,W_PASS3);
                std::__cxx11::string::~string((string *)&local_998);
              }
            }
            else if (entry._4_4_ != 0x80) {
              uVar12 = (ulong)entry._4_4_;
              puStack_970 = &fatIndex + uVar12 * 4;
              if (entry._4_4_ + 1 == (uint)trdHead.info._unused[0xdb]) {
                local_971 = (char)((int)((uint)trdHead.catalog[uVar12].filename[5] +
                                        (uint)trdHead.catalog[uVar12].filename[6]) >> 4) +
                            trdHead.catalog[uVar12].filename[7];
                local_972 = trdHead.catalog[uVar12].filename[5] +
                            trdHead.catalog[uVar12].filename[6] & 0xf;
                if ((local_972 != trdHead.info._unused[0xd8]) ||
                   (local_971 != trdHead.info._unused[0xd9])) {
                  iVar11 = ReturnWithError("TRD free sector was not connected to last file",fname,
                                           (FILE *)trdHead.info._248_8_);
                  fname_local._7_1_ = iVar11 != 0;
                  goto LAB_0012aabf;
                }
                trdHead.info._unused[0xd8] = trdHead.catalog[uVar12].filename[6];
                trdHead.info._unused[0xd9] = trdHead.catalog[uVar12].filename[7];
                trdHead.info._unused._220_2_ =
                     trdHead.info._unused._220_2_ + (ushort)trdHead.catalog[uVar12].filename[5];
                trdHead.info._unused[0xdb] = trdHead.info._unused[0xdb] + 0xff;
                *(undefined1 *)puStack_970 = 0;
              }
              else {
                *(undefined1 *)puStack_970 = 1;
                trdHead.info.password[2] = trdHead.info.password[2] + '\x01';
              }
            }
            entry._4_4_ = (uint)trdHead.info._unused[0xdb];
          }
          else if (entry._4_4_ == 0x80) {
            iVar11 = ReturnWithError("TRD image does not have a specified file to add data",fname,
                                     (FILE *)trdHead.info._248_8_);
            fname_local._7_1_ = iVar11 != 0;
            goto LAB_0012aabf;
          }
          if (entry._4_4_ == 0x80) {
            iVar11 = ReturnWithError("TRD image is full of files",fname,(FILE *)trdHead.info._248_8_
                                    );
            fname_local._7_1_ = iVar11 != 0;
          }
          else {
            uVar12 = (ulong)entry._4_4_;
            __s1 = &fatIndex + uVar12 * 4;
            iVar11 = memcmp(__s1,(byte *)((long)&nameWarning + 2),(long)iStack_44);
            bVar14 = iVar11 != 0;
            if (((char)*__s1 == '\0') || (!bVar14)) {
              if ((ushort)trdHead.info._unused._220_2_ < (ushort)trdf.filename[5]) {
                iVar11 = ReturnWithError("TRD image has not enough free space",fname,
                                         (FILE *)trdHead.info._248_8_);
                fname_local._7_1_ = iVar11 != 0;
              }
              else {
                if ((trdf.ext & 1) == 0) {
                  local_a34 = 0;
                }
                else {
                  local_a34 = (uint)trdHead.catalog[uVar12].filename[5];
                }
                if (local_a34 + trdf.filename[5] < 0x100) {
                  if ((trdf.ext & 1) == 0) {
                    if (bVar14) {
                      trdf.filename[6] = trdHead.info._unused[0xd8];
                      trdf.filename[7] = trdHead.info._unused[0xd9];
                    }
                    else {
                      trdf.filename[6] = trdHead.catalog[uVar12].filename[6];
                      trdf.filename[7] = trdHead.catalog[uVar12].filename[7];
                    }
                    *(undefined8 *)__s1 = stack0xffffffffffffffc2;
                    *(ulong *)trdHead.catalog[uVar12].filename =
                         CONCAT17(trdf.filename[7],
                                  CONCAT16(trdf.filename[6],
                                           CONCAT15(trdf.filename[5],
                                                    CONCAT23(trdf.filename._3_2_,
                                                             CONCAT12(trdf.filename[2],
                                                                      CONCAT11(trdf.filename[1],
                                                                               trdf.filename[0])))))
                                 );
                  }
                  else {
                    trdHead.catalog[uVar12].filename[5] =
                         trdHead.catalog[uVar12].filename[5] + trdf.filename[5];
                  }
                  if ((trdf.ext & 1) != 0) {
                    lVar5 = STrdDisc::fileOffset
                                      ((ulong)trdHead.catalog[uVar12].filename[7],
                                       (ulong)trdHead.catalog[uVar12].filename[6]);
                    lVar6 = lVar5 + (long)(int)local_a34 * 0x100;
                    bVar1 = trdHead.catalog[uVar12].filename[5];
                    lVar7 = STrdDisc::fileOffset
                                      ((ulong)trdHead.info._unused[0xd9],
                                       (ulong)trdHead.info._unused[0xd8]);
                    if (lVar6 < lVar7) {
                      dataToMove._M_t.
                      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                      .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                           (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>
                            )(lVar7 - lVar6);
                      __p = (uchar *)operator_new__((ulong)dataToMove._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl);
                      std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
                      unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
                                ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *
                                 )&entryIndex,__p);
                      puVar8 = std::
                               unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                               get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                    *)&entryIndex);
                      if (puVar8 == (pointer)0x0) {
                        ErrorOOM();
                      }
                      iVar11 = fseek((FILE *)trdHead.info._248_8_,lVar6,0);
                      uVar3 = dataToMove;
                      if (iVar11 == 0) {
                        puVar8 = std::
                                 unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                 ::get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                        *)&entryIndex);
                        _Var9.
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                        .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                             (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                             fread(puVar8,1,(size_t)dataToMove._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl,(FILE *)trdHead.info._248_8_);
                        if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>)
                            uVar3._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
                            _Var9.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl) {
                          iVar11 = fseek((FILE *)trdHead.info._248_8_,lVar5 + (ulong)bVar1 * 0x100,0
                                        );
                          uVar3 = dataToMove;
                          if (iVar11 == 0) {
                            puVar8 = std::
                                     unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                     ::get((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                            *)&entryIndex);
                            _Var9.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
                                 (__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  )fwrite(puVar8,1,(size_t)dataToMove._M_t.
                                                                                                                      
                                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                                  .super__Head_base<0UL,_unsigned_char_*,_false>.
                                                  _M_head_impl,(FILE *)trdHead.info._248_8_);
                            if ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                 )uVar3._M_t.
                                  super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                  .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
                                _Var9.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl) {
                              std::
                              unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                              reset((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                     *)&entryIndex,(nullptr_t)0x0);
                              entry_2._0_4_ = 0;
                              while (((uint)entry_2 < 0x80 &&
                                     (uVar13 = (ulong)(uint)entry_2,
                                     (char)(&fatIndex)[uVar13 * 4] != '\0'))) {
                                if ((uint)entry_2 != entry._4_4_) {
                                  lVar6 = STrdDisc::fileOffset
                                                    ((ulong)trdHead.catalog[uVar13].filename[7],
                                                     (ulong)trdHead.catalog[uVar13].filename[6]);
                                  if ((uint)entry_2 < entry._4_4_ != lVar6 < lVar5) {
                                    iVar11 = ReturnWithError("TRD inconsistent catalog data",fname,
                                                             (FILE *)trdHead.info._248_8_);
                                    fname_local._7_1_ = iVar11 != 0;
                                    bVar2 = true;
                                    goto LAB_0012a8b3;
                                  }
                                  if (lVar5 <= lVar6) {
                                    trdHead.catalog[uVar13].filename[7] =
                                         trdHead.catalog[uVar13].filename[7] +
                                         (char)((int)((uint)trdf.filename[5] +
                                                     (uint)trdHead.catalog[uVar13].filename[6]) >> 4
                                               );
                                    trdHead.catalog[uVar13].filename[6] =
                                         trdf.filename[5] + trdHead.catalog[uVar13].filename[6] &
                                         0xf;
                                  }
                                }
                                entry_2._0_4_ = (uint)entry_2 + 1;
                              }
                              bVar2 = false;
                            }
                            else {
                              iVar11 = ReturnWithError("TRD write error",fname,
                                                       (FILE *)trdHead.info._248_8_);
                              fname_local._7_1_ = iVar11 != 0;
                              bVar2 = true;
                            }
                          }
                          else {
                            iVar11 = ReturnWithError("TRD image has wrong format",fname,
                                                     (FILE *)trdHead.info._248_8_);
                            fname_local._7_1_ = iVar11 != 0;
                            bVar2 = true;
                          }
                        }
                        else {
                          iVar11 = ReturnWithError("TRD read error",fname,
                                                   (FILE *)trdHead.info._248_8_);
                          fname_local._7_1_ = iVar11 != 0;
                          bVar2 = true;
                        }
                      }
                      else {
                        iVar11 = ReturnWithError("TRD image has wrong format",fname,
                                                 (FILE *)trdHead.info._248_8_);
                        fname_local._7_1_ = iVar11 != 0;
                        bVar2 = true;
                      }
LAB_0012a8b3:
                      std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::
                      ~unique_ptr((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>
                                   *)&entryIndex);
                      if (bVar2) goto LAB_0012aabf;
                    }
                  }
                  lStack_a08 = STrdDisc::fileOffset
                                         ((ulong)trdHead.catalog[uVar12].filename[7],
                                          (ulong)trdHead.catalog[uVar12].filename[6]);
                  lStack_a08 = (long)(int)local_a34 * 0x100 + lStack_a08;
                  iVar11 = fseek((FILE *)trdHead.info._248_8_,lStack_a08,0);
                  if (iVar11 == 0) {
                    iVar11 = SaveRAM((FILE *)trdHead.info._248_8_,start,stack0xffffffffffffffd8);
                    if (iVar11 == 0) {
                      iVar11 = ReturnWithError("TRD write device RAM error",fname,
                                               (FILE *)trdHead.info._248_8_);
                      fname_local._7_1_ = iVar11 != 0;
                    }
                    else {
                      if (((trdf.ext & 1) == 0) && (-1 < (int)trdf._10_4_)) {
                        local_a0c = 0x80;
                        local_a0b = 0xaa;
                        local_a0a = trdf.addressHi;
                        local_a09 = (undefined1)trdf.length;
                        sVar10 = fwrite(&local_a0c,1,4,(FILE *)trdHead.info._248_8_);
                        if (sVar10 != 4) {
                          iVar11 = ReturnWithError("Write error",fname,(FILE *)trdHead.info._248_8_)
                          ;
                          fname_local._7_1_ = iVar11 != 0;
                          goto LAB_0012aabf;
                        }
                      }
                      trdHead.info._unused[0xd9] =
                           trdHead.info._unused[0xd9] +
                           (char)((int)((uint)trdf.filename[5] + (uint)trdHead.info._unused[0xd8])
                                 >> 4);
                      trdHead.info._unused[0xd8] =
                           trdf.filename[5] + trdHead.info._unused[0xd8] & 0xf;
                      trdHead.info._unused._220_2_ =
                           trdHead.info._unused._220_2_ - (ushort)trdf.filename[5];
                      if (bVar14) {
                        trdHead.info._unused[0xdb] = trdHead.info._unused[0xdb] + '\x01';
                      }
                      iVar11 = fseek((FILE *)trdHead.info._248_8_,0,0);
                      if (iVar11 == 0) {
                        bVar14 = STrdHead::writeToFile
                                           ((STrdHead *)&fatIndex,(FILE *)trdHead.info._248_8_);
                        if (bVar14) {
                          fclose((FILE *)trdHead.info._248_8_);
                          fname_local._7_1_ = 1;
                        }
                        else {
                          iVar11 = ReturnWithError("TRD write error",fname,
                                                   (FILE *)trdHead.info._248_8_);
                          fname_local._7_1_ = iVar11 != 0;
                        }
                      }
                      else {
                        iVar11 = ReturnWithError("TRD image has wrong format",fname,
                                                 (FILE *)trdHead.info._248_8_);
                        fname_local._7_1_ = iVar11 != 0;
                      }
                    }
                  }
                  else {
                    iVar11 = ReturnWithError("TRD image has wrong format",fname,
                                             (FILE *)trdHead.info._248_8_);
                    fname_local._7_1_ = iVar11 != 0;
                  }
                }
                else {
                  iVar11 = ReturnWithError("zx.trdimage_add_file: new sector length over 0xFF max",
                                           fname,(FILE *)trdHead.info._248_8_);
                  fname_local._7_1_ = iVar11 != 0;
                }
              }
            }
            else {
              iVar11 = ReturnWithError("TRD inconsistent catalog data",fname,
                                       (FILE *)trdHead.info._248_8_);
              fname_local._7_1_ = iVar11 != 0;
            }
          }
        }
        else {
          iVar11 = ReturnWithError("TRD image read error",fname,(FILE *)trdHead.info._248_8_);
          fname_local._7_1_ = iVar11 != 0;
        }
      }
    }
  }
  else {
    Error("zx.trdimage_add_file: provided start+length will run out of device memory",bp,PASS3);
    fname_local._7_1_ = 0;
  }
LAB_0012aabf:
  return (bool)(fname_local._7_1_ & 1);
}

Assistant:

bool TRD_AddFile(const std::filesystem::path & fname, const char* fhobname, int start, int length, int autostart, bool replace, bool addplace, int lengthMinusVars) {
	// do some preliminary checks with file name and autostart - prepare final catalog entry data
	union {
		STrdFile trdf;			// structure to hold future form of catalog record about new file
		byte longFname[12];		// 12 byte access for TRD_FileNameToBytes (to avoid LGTM alert)
	};
	int Lname = 0;
	// this will overwrite also first byte of "trd.length" (12 bytes are affected, not just 11)
	const ETrdFileName nameWarning = TRD_FileNameToBytes(fhobname, longFname, Lname);
	const bool isExtensionB = ('B' == trdf.ext);
	if (!addplace) {
		if (INVALID_EXTENSION == nameWarning) {
			WarningById(W_TRD_EXT_INVALID, fhobname);
		}
		if (THREE_LETTER_EXTENSION == nameWarning) {
			WarningById(W_TRD_EXT_3, fhobname);
			if (isExtensionB) {
				WarningById(W_TRD_EXT_B, fhobname);
				Lname = STrdFile::NAME_FULL_SZ;
			}
		}
	}
	if (0 <= autostart && (!isExtensionB || 9999 < autostart)) {
		Warning("zx.trdimage_add_file: autostart value is BASIC program line number (0..9999) (in lua use -1 otherwise).");
		autostart = -1;
	}
	if (-1 != lengthMinusVars) {
		if (!isExtensionB) {
			Error("zx.trdimage_add_file: length without variables is for BASIC files only.");
			return 0;
		} else if (lengthMinusVars < 0 || length < lengthMinusVars) {
			Error("zx.trdimage_add_file: length without variables is not in <0..length> range.");
			return 0;
		}
	}

	// more validations - for Lua (or SAVETRD letting wrong values go through)
	if (!DeviceID) {
		Error("zx.trdimage_add_file: this function available only in real device emulation mode.");
		return 0;
	}
	if (start < 0 || 0xFFFF < start) {
		Error("zx.trdimage_add_file: start address must be in 0000..FFFF range", bp, PASS3);
		return 0;
	}
	if (length <= 0 || 0xFF00 < length) {
		// zero length not allowed any more, because TRD docs on internet are imprecise
		// and I'm not sure what is the correct way of saving zero length file => error
		Error("zx.trdimage_add_file: length must be in 0001..FF00 range", bp, PASS3);
		return 0;
	}
	if (0x10000 < start+length) {
		Error("zx.trdimage_add_file: provided start+length will run out of device memory", bp, PASS3);
		return 0;
	}
	trdf.length = word(length);
	trdf.sectorLength = byte((length + 255 + (0 <= autostart ? 4 : 0))>>8);
	if (isExtensionB) {
		trdf.addressLo = byte(length);
		trdf.addressHi = byte(length>>8);
		if (-1 != lengthMinusVars) trdf.length = word(lengthMinusVars);
	} else {
		if (Lname <= int(STrdFile::NAME_FULL_SZ)) {
			trdf.addressLo = byte(start);	// single letter extension => "start" field is used for start value
			trdf.addressHi = byte(start>>8);
		}
	}
	if (0 == trdf.sectorLength) {	// can overflow only when 0xFF00 length with autostart => 0
		Error("zx.trdimage_add_file: sector length over 0xFF max", bp, PASS3);
		return 0;
	}

	// read 9 sectors of disk into "trdHead" (contains root directory catalog and disk info data)
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "r+b")) return ReturnWithError("Error opening file", fname, ff);
	STrdHead trdHead;
	if (!trdHead.readFromFile(ff)) {
		return ReturnWithError("TRD image read error", fname, ff);
	}

	// check if the requested file is already on the disk
	// in "add" or "replace" mode also delete all extra ones with the same name, keeping only last
	unsigned fileIndex = STrdHead::NUM_OF_FILES_MAX;
	for (unsigned fatIndex = 0; fatIndex < STrdHead::NUM_OF_FILES_MAX; ++fatIndex) {
		auto & entry = trdHead.catalog[fatIndex];
		if (0 == entry.filename[0]) break;		// beyond last FAT record, finish the loop
		if (memcmp(entry.filename, trdf.filename, Lname)) continue;	// different file name -> continue
		// in "add" or "replace" mode delete the previous incarnations of this filename (returns only last one)
		if ((addplace || replace) && STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			// delete the previously found file (it stays in catalog as deleted file)
			trdHead.catalog[fileIndex].filename[0] = 1;
			++trdHead.info.numOfDeleted;
		}
		// remember the position of last entry with the requested file name
		fileIndex = fatIndex;
	}

	// check and process [un]found file based on the requested mode
	if (addplace) {
		// in "add" mode the file must already exist
		if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
			return ReturnWithError("TRD image does not have a specified file to add data", fname, ff);
		}
	} else if (replace) {
		// in "replace" mode delete also the last occurance
		if (STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			auto & entry = trdHead.catalog[fileIndex];
			if (fileIndex + 1 == trdHead.info.numOfFiles) {		// if last file in the catalog
				// It's last file of catalog, erase it as if it was not on disc at all
				// verify if the free space starts just where last file ends (integrity of TRD image)
				const byte nextTrack = ((entry.sectorLength + entry.startSector) >> 4) + entry.startTrack;
				const byte nextSector = (entry.sectorLength + entry.startSector) & 0x0F;
				// if file connects to first free sector, salvage the space back
				if (nextSector != trdHead.info.freeSector || nextTrack != trdHead.info.freeTrack) {
					return ReturnWithError("TRD free sector was not connected to last file", fname, ff);
				}
				// return the sectors used by file back to "free sectors" pool
				trdHead.info.freeSector = entry.startSector;
				trdHead.info.freeTrack = entry.startTrack;
				trdHead.info.numOfFreeSectors += entry.sectorLength;
				// delete the file (wipe catalog entry completely as if it was not written)
				--trdHead.info.numOfFiles;
				entry.filename[0] = 0;
			} else {
				// delete the file (but it stays in catalog as deleted file) (and new file will be added)
				entry.filename[0] = 1;
				++trdHead.info.numOfDeleted;
			}
		}
		fileIndex = trdHead.info.numOfFiles;
	} else {
		// in "normal" mode warn when file already exists
		if (STrdHead::NUM_OF_FILES_MAX != fileIndex) {
			// to keep legacy behaviour of older sjasmplus versions, this is just warning
			// and the same file will be added to end of directory any way
			WarningById(W_TRD_DUPLICATE, fname.string().c_str());
		}
		fileIndex = trdHead.info.numOfFiles;
	}

	// fileIndex should point to valid record in catalog, verify the status and free space
	if (STrdHead::NUM_OF_FILES_MAX == fileIndex) {
		return ReturnWithError("TRD image is full of files", fname, ff);
	}
	auto & target = trdHead.catalog[fileIndex];
	const bool isNewTarget = !!memcmp(target.filename, trdf.filename, Lname);
	if (0 != target.filename[0] && isNewTarget) {
		// the target entry must have zero as first char or must have requested name
		return ReturnWithError("TRD inconsistent catalog data", fname, ff);
	}
	if (trdHead.info.numOfFreeSectors < trdf.sectorLength) {
		return ReturnWithError("TRD image has not enough free space", fname, ff);
	}
	const int keepSectors = addplace ? target.sectorLength : 0;
	if (0xFF < keepSectors + int(trdf.sectorLength)) {
		return ReturnWithError("zx.trdimage_add_file: new sector length over 0xFF max",  fname, ff);
	}

	// set the target record in catalog
	if (addplace) {
		// just add sector length, keep target.length at old value (no idea why, ask Dart Alver)
		target.sectorLength += trdf.sectorLength;
		// keeps basically EVERYTHING in the old catalog entry as it was, only sector length is raised
	} else {
		// finalize the prepared catalog entry record with starting position
		if (isNewTarget) {
			trdf.startSector = trdHead.info.freeSector;
			trdf.startTrack = trdHead.info.freeTrack;
		} else {
			trdf.startSector = target.startSector;
			trdf.startTrack = target.startTrack;
		}
		// write it to the actual catalog
		target = trdf;
	}

	// in "add" mode shift all data sectors to make room for the newly added ones
	if (addplace) {
		const long targetPos = STrdDisc::fileOffset(target.startTrack, target.startSector);
		const long oldTargetEndPos = targetPos + (keepSectors * STrdDisc::SECTOR_SZ);
		const long newTargetEndPos = targetPos + (target.sectorLength * STrdDisc::SECTOR_SZ);
		const long freePos = STrdDisc::fileOffset(trdHead.info.freeTrack, trdHead.info.freeSector);
		if (oldTargetEndPos < freePos) {	// some data after old file -> shift them a bit
			// first move the data inside the TRD image
			size_t dataToMoveLength = freePos - oldTargetEndPos;
			std::unique_ptr<byte[]> dataToMove(new byte[dataToMoveLength]);
			if (nullptr == dataToMove.get()) ErrorOOM();
			if (fseek(ff, oldTargetEndPos, SEEK_SET)) {
				return ReturnWithError("TRD image has wrong format", fname, ff);
			}
			if (dataToMoveLength != fread(dataToMove.get(), 1, dataToMoveLength, ff)) {
				return ReturnWithError("TRD read error", fname, ff);
			}
			if (fseek(ff, newTargetEndPos, SEEK_SET)) {
				return ReturnWithError("TRD image has wrong format", fname, ff);
			}
			// first modification of the provided TRD file (since here, if something fails, the file is damaged)
			if (dataToMoveLength != fwrite(dataToMove.get(), 1, dataToMoveLength, ff)) {
				return ReturnWithError("TRD write error", fname, ff);
			}
			dataToMove.reset();		// delete allocated memory already here
			// adjust all catalog entries which got the content sectors shifted
			for (unsigned entryIndex = 0; entryIndex < STrdHead::NUM_OF_FILES_MAX; ++entryIndex) {
				auto & entry = trdHead.catalog[entryIndex];
				if (0 == entry.filename[0]) break;		// beyond last FAT record, finish the loop
				if (entryIndex == fileIndex) continue;	// ignore the "target" itself
				// check if all files in catalog after target are also affected by content shift and vice versa
				const long entryPos = STrdDisc::fileOffset(entry.startTrack, entry.startSector);
				if ((entryIndex < fileIndex) != (entryPos < targetPos)) {
					return ReturnWithError("TRD inconsistent catalog data", fname, ff);
				}
				if (entryPos < targetPos) continue;		// this one is ahead of the target file
				// the file got shifted content => update the catalog entry
				entry.startTrack += (trdf.sectorLength + entry.startSector) >> 4;
				entry.startSector = (trdf.sectorLength + entry.startSector) & 0x0F;
			}
		} // END if (oldTargetEndPos < freePos)
	} // END if (addplace)

	// save the new data into the TRD (content sectors)
	long writePos = STrdDisc::fileOffset(target.startTrack, target.startSector);
	writePos += keepSectors * STrdDisc::SECTOR_SZ;
	if (fseek(ff, writePos, SEEK_SET)) {
		return ReturnWithError("TRD image has wrong format", fname, ff);
	}
	if (!SaveRAM(ff, start, length)) {
		return ReturnWithError("TRD write device RAM error", fname, ff);
	}
	if (!addplace && 0 <= autostart) {
		byte abin[] {0x80, 0xAA, static_cast<byte>(autostart), static_cast<byte>(autostart>>8)};
		if (4 != fwrite(abin, 1, 4, ff)) {
			return ReturnWithError("Write error", fname, ff);
		}
	}

	// update next free sector/track position
	trdHead.info.freeTrack += (trdf.sectorLength + trdHead.info.freeSector) >> 4;
	trdHead.info.freeSector = (trdf.sectorLength + trdHead.info.freeSector) & 0x0F;
	// update remaining free sectors
	trdHead.info.numOfFreeSectors -= trdf.sectorLength;
	if (isNewTarget) ++trdHead.info.numOfFiles;

	// update whole catalog and disc info with modified data
	if (fseek(ff, 0, SEEK_SET)) {
		return ReturnWithError("TRD image has wrong format", fname, ff);
	}
	if (!trdHead.writeToFile(ff)) {
		return ReturnWithError("TRD write error", fname, ff);
	}

	fclose(ff);
	return 1;
}